

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_sah.h
# Opt level: O2

void __thiscall
embree::sse2::GeneralBVHBuilder::
BuilderT<embree::sse2::GeneralBVHBuilder::BuildRecordT<embree::sse2::PrimInfoExtRange,_embree::sse2::Split2<embree::sse2::BinSplit<32UL>,_embree::sse2::SpatialBinSplit<16UL>_>_>,_embree::sse2::HeuristicArraySpatialSAH<embree::sse2::QuadSplitterFactory,_embree::PrimRef,_32UL,_16UL>,_embree::sse2::PrimInfoExtRange,_embree::PrimRef,_embree::NodeRefPtr<4>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNode_t<embree::NodeRefPtr<4>,_4>::Create2,_embree::AABBNode_t<embree::NodeRefPtr<4>,_4>::Set2,_embree::sse2::BVHBuilderBinnedFastSpatialSAH::CreateLeafExt<embree::NodeRefPtr<4>,_embree::sse2::CreateLeafSpatial<4,_embree::QuadMv<4>_>_>,_embree::sse2::GeneralBVHBuilder::DefaultCanCreateLeafFunc<embree::PrimRef,_embree::sse2::PrimInfoExtRange>,_embree::sse2::GeneralBVHBuilder::DefaultCanCreateLeafSplitFunc<embree::PrimRef,_embree::sse2::PrimInfoExtRange>,_embree::Scene::BuildProgressMonitorInterface>
::BuilderT(BuilderT<embree::sse2::GeneralBVHBuilder::BuildRecordT<embree::sse2::PrimInfoExtRange,_embree::sse2::Split2<embree::sse2::BinSplit<32UL>,_embree::sse2::SpatialBinSplit<16UL>_>_>,_embree::sse2::HeuristicArraySpatialSAH<embree::sse2::QuadSplitterFactory,_embree::PrimRef,_32UL,_16UL>,_embree::sse2::PrimInfoExtRange,_embree::PrimRef,_embree::NodeRefPtr<4>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNode_t<embree::NodeRefPtr<4>,_4>::Create2,_embree::AABBNode_t<embree::NodeRefPtr<4>,_4>::Set2,_embree::sse2::BVHBuilderBinnedFastSpatialSAH::CreateLeafExt<embree::NodeRefPtr<4>,_embree::sse2::CreateLeafSpatial<4,_embree::QuadMv<4>_>_>,_embree::sse2::GeneralBVHBuilder::DefaultCanCreateLeafFunc<embree::PrimRef,_embree::sse2::PrimInfoExtRange>,_embree::sse2::GeneralBVHBuilder::DefaultCanCreateLeafSplitFunc<embree::PrimRef,_embree::sse2::PrimInfoExtRange>,_embree::Scene::BuildProgressMonitorInterface>
           *this,PrimRef *prims,
          HeuristicArraySpatialSAH<embree::sse2::QuadSplitterFactory,_embree::PrimRef,_32UL,_16UL>
          *heuristic,CreateAlloc *createAlloc,Create2 *createNode,Set2 *updateNode,
          CreateLeafExt<embree::NodeRefPtr<4>,_embree::sse2::CreateLeafSpatial<4,_embree::QuadMv<4>_>_>
          *createLeaf,
          DefaultCanCreateLeafFunc<embree::PrimRef,_embree::sse2::PrimInfoExtRange> *canCreateLeaf,
          DefaultCanCreateLeafSplitFunc<embree::PrimRef,_embree::sse2::PrimInfoExtRange>
          *canCreateLeafSplit,BuildProgressMonitorInterface *progressMonitor,Settings *settings)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  float fVar6;
  float fVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  size_t sVar10;
  size_t sVar11;
  size_t sVar12;
  size_t sVar13;
  size_t sVar14;
  size_t sVar15;
  undefined8 *puVar16;
  allocator local_39;
  string local_38 [32];
  
  uVar1 = *(undefined4 *)((long)&settings->branchingFactor + 4);
  sVar10 = settings->maxDepth;
  uVar2 = *(undefined4 *)((long)&settings->maxDepth + 4);
  sVar11 = settings->logBlockSize;
  uVar3 = *(undefined4 *)((long)&settings->logBlockSize + 4);
  sVar12 = settings->minLeafSize;
  uVar4 = *(undefined4 *)((long)&settings->minLeafSize + 4);
  sVar13 = settings->maxLeafSize;
  uVar5 = *(undefined4 *)((long)&settings->maxLeafSize + 4);
  fVar6 = settings->travCost;
  fVar7 = settings->intCost;
  sVar14 = settings->singleThreadThreshold;
  uVar8 = *(undefined4 *)((long)&settings->singleThreadThreshold + 4);
  sVar15 = settings->primrefarrayalloc;
  uVar9 = *(undefined4 *)((long)&settings->primrefarrayalloc + 4);
  *(int *)&(this->cfg).branchingFactor = (int)settings->branchingFactor;
  *(undefined4 *)((long)&(this->cfg).branchingFactor + 4) = uVar1;
  *(int *)&(this->cfg).maxDepth = (int)sVar10;
  *(undefined4 *)((long)&(this->cfg).maxDepth + 4) = uVar2;
  *(int *)&(this->cfg).singleThreadThreshold = (int)sVar14;
  *(undefined4 *)((long)&(this->cfg).singleThreadThreshold + 4) = uVar8;
  *(int *)&(this->cfg).primrefarrayalloc = (int)sVar15;
  *(undefined4 *)((long)&(this->cfg).primrefarrayalloc + 4) = uVar9;
  *(int *)&(this->cfg).maxLeafSize = (int)sVar13;
  *(undefined4 *)((long)&(this->cfg).maxLeafSize + 4) = uVar5;
  (this->cfg).travCost = fVar6;
  (this->cfg).intCost = fVar7;
  *(int *)&(this->cfg).logBlockSize = (int)sVar11;
  *(undefined4 *)((long)&(this->cfg).logBlockSize + 4) = uVar3;
  *(int *)&(this->cfg).minLeafSize = (int)sVar12;
  *(undefined4 *)((long)&(this->cfg).minLeafSize + 4) = uVar4;
  this->prims = prims;
  this->heuristic = heuristic;
  this->createAlloc = createAlloc;
  this->createNode = createNode;
  this->updateNode = updateNode;
  this->createLeaf = createLeaf;
  this->canCreateLeaf = canCreateLeaf;
  this->canCreateLeafSplit = canCreateLeafSplit;
  this->progressMonitor = progressMonitor;
  if ((this->cfg).branchingFactor < 0x11) {
    return;
  }
  puVar16 = (undefined8 *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string(local_38,"bvh_builder: branching factor too large",&local_39);
  *puVar16 = &PTR__rtcore_error_021d38e0;
  *(undefined4 *)(puVar16 + 1) = 1;
  std::__cxx11::string::string((string *)(puVar16 + 2),local_38);
  __cxa_throw(puVar16,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
}

Assistant:

BuilderT (PrimRef* prims,
                    Heuristic& heuristic,
                    const CreateAllocFunc& createAlloc,
                    const CreateNodeFunc& createNode,
                    const UpdateNodeFunc& updateNode,
                    const CreateLeafFunc& createLeaf,
                    const CanCreateLeafFunc& canCreateLeaf,
                    const CanCreateLeafSplitFunc& canCreateLeafSplit,
                    const ProgressMonitor& progressMonitor,
                    const Settings& settings) :
                    cfg(settings),
                    prims(prims),
                    heuristic(heuristic),
                    createAlloc(createAlloc),
                    createNode(createNode),
                    updateNode(updateNode),
                    createLeaf(createLeaf),
                    canCreateLeaf(canCreateLeaf),
                    canCreateLeafSplit(canCreateLeafSplit),
                    progressMonitor(progressMonitor)
          {
            if (cfg.branchingFactor > MAX_BRANCHING_FACTOR)
              throw_RTCError(RTC_ERROR_UNKNOWN,"bvh_builder: branching factor too large");
          }